

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_CallExprPrecedence_Test::ExprWriterTest_CallExprPrecedence_Test
          (ExprWriterTest_CallExprPrecedence_Test *this)

{
  ExprWriterTest::ExprWriterTest(&this->super_ExprWriterTest);
  (this->super_ExprWriterTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprWriterTest_0016c750;
  (this->super_ExprWriterTest).super_ExprFactory._vptr_BasicExprFactory =
       (_func_int **)&PTR__ExprWriterTest_CallExprPrecedence_Test_0016c790;
  return;
}

Assistant:

TEST_F(ExprWriterTest, CallExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1);
  auto f = AddFunction("foo", -1);
  mp::Expr args[] = {
      MakeCall(f, mp::MakeArrayRef<mp::Expr>(0, 0)),
      MakeBinary(ex::ADD, x1, MakeConst(5)),
      MakeConst(7),
      MakeUnary(ex::FLOOR, x2)
  };
  CHECK_WRITE("foo(foo(), x1 + 5, 7, floor(x2))", MakeCall(f, args));
}